

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O2

json __thiscall lrit::toJSON_abi_cxx11_(lrit *this,File *f)

{
  json_value extraout_RDX;
  json jVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> b;
  HeaderMap m;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_58;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_40;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_58,&f->header_);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::_Rb_tree(&local_40,&(f->m_)._M_t);
  toJSON_abi_cxx11_(this,(Buffer *)&_Stack_58,(HeaderMap *)&local_40);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_40);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_58);
  jVar1.m_value.object = extraout_RDX.object;
  jVar1._0_8_ = this;
  return jVar1;
}

Assistant:

json toJSON(const File& f) {
  auto b = f.getHeaderBuffer();
  auto m = f.getHeaderMap();
  return toJSON(b, m);
}